

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::Contribute_v2_local
          (TPZDohrSubstruct<std::complex<float>_> *this,
          TPZFMatrix<std::complex<float>_> *residual_local,
          TPZFMatrix<std::complex<float>_> *v2_local)

{
  int iVar1;
  int64_t iVar2;
  TPZFMatrix<std::complex<float>_> *this_00;
  TPZFMatrix<std::complex<float>_> *A;
  pair<int,_int> *ppVar3;
  complex<float> *pcVar4;
  long *in_RDX;
  TPZBaseMatrix *in_RSI;
  long in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  pair<int,_int> ind_1;
  int ic_1;
  TPZFMatrix<std::complex<float>_> zi;
  TPZFMatrix<std::complex<float>_> temp2;
  TPZFMatrix<std::complex<float>_> CstarKW;
  TPZFMatrix<std::complex<float>_> Lambda_star;
  TPZFMatrix<std::complex<float>_> KWeightedResidual;
  TPZFMatrix<std::complex<float>_> I_lambda;
  int nglob;
  int nnull;
  int ncoarse;
  pair<int,_int> ind;
  int ic;
  int i;
  int neqs;
  TPZFMatrix<std::complex<float>_> LocalWeightedResidual;
  int ncols;
  complex<float> *in_stack_fffffffffffffac8;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffae8;
  complex<float> in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  complex<float> *in_stack_fffffffffffffb38;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffb40;
  pair<int,_int> *in_stack_fffffffffffffb48;
  TPZMatrix<std::complex<float>_> *this_01;
  int64_t in_stack_fffffffffffffb78;
  _ComplexT _Var5;
  int64_t in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  int iVar6;
  complex<float> local_470 [14];
  int in_stack_fffffffffffffc04;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffc08;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffc10;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffc18;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffc20;
  complex<float> in_stack_fffffffffffffc28;
  complex<float> in_stack_fffffffffffffc30;
  TPZMatrix<std::complex<float>_> *in_stack_fffffffffffffcb0;
  complex<float> in_stack_fffffffffffffcb8;
  complex<float> in_stack_fffffffffffffcc0;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffd78;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffd80;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffd88;
  TPZStepSolver<std::complex<float>_> *in_stack_fffffffffffffd90;
  int local_e0;
  int local_d4;
  int local_d0;
  TPZMatrix<std::complex<float>_> local_b8 [4];
  int local_1c;
  long *local_18;
  
  local_18 = in_RDX;
  iVar2 = TPZBaseMatrix::Cols(in_RSI);
  local_1c = (int)iVar2;
  this_00 = (TPZFMatrix<std::complex<float>_> *)(long)*(int *)(in_RDI + 0x2b8);
  A = (TPZFMatrix<std::complex<float>_> *)(long)local_1c;
  this_01 = local_b8;
  std::complex<float>::complex((complex<float> *)this_01,0.0,0.0);
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (this_00,(int64_t)in_stack_fffffffffffffb48,(int64_t)in_stack_fffffffffffffb40,
             in_stack_fffffffffffffb38);
  iVar2 = TPZVec<std::pair<int,_int>_>::NElements((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x5d8));
  iVar1 = (int)iVar2;
  for (local_d4 = 0; iVar6 = (int)((ulong)in_stack_fffffffffffffb48 >> 0x20), local_d4 < local_1c;
      local_d4 = local_d4 + 1) {
    for (local_d0 = 0; local_d0 < iVar1; local_d0 = local_d0 + 1) {
      in_stack_fffffffffffffb48 =
           TPZVec<std::pair<int,_int>_>::operator[]
                     ((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x5d8),(long)local_d0);
      local_e0 = (*in_stack_fffffffffffffb48).first;
      in_stack_fffffffffffffb40 =
           (TPZFMatrix<std::complex<float>_> *)
           TPZVec<std::complex<float>_>::operator[]
                     ((TPZVec<std::complex<float>_> *)(in_RDI + 0x4b0),(long)local_e0);
      in_stack_fffffffffffffb38 =
           TPZFMatrix<std::complex<float>_>::operator()
                     ((TPZFMatrix<std::complex<float>_> *)in_stack_fffffffffffffaf0._M_value,
                      (int64_t)in_stack_fffffffffffffae8,
                      CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      std::operator*(in_stack_fffffffffffffac8,(complex<float> *)0x1ffc4e7);
      in_stack_fffffffffffffb30 = extraout_XMM0_Dc;
      in_stack_fffffffffffffb34 = extraout_XMM0_Dd;
      TPZFMatrix<std::complex<float>_>::operator()
                ((TPZFMatrix<std::complex<float>_> *)in_stack_fffffffffffffaf0._M_value,
                 (int64_t)in_stack_fffffffffffffae8,
                 CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      std::complex<float>::operator+=
                ((complex<float> *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                 (complex<float> *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    }
  }
  TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x490));
  TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x228));
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,
             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
  TPZFMatrix<std::complex<float>_>::Zero(in_stack_fffffffffffffad0);
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,
             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
  TPZStepSolver<std::complex<float>_>::Solve
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,
             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,
             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
  std::complex<float>::complex((complex<float> *)&stack0xfffffffffffffcc0,-1.0,0.0);
  std::complex<float>::complex((complex<float> *)&stack0xfffffffffffffcb8,0.0,0.0);
  TPZFMatrix<std::complex<float>_>::MultAdd
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             in_stack_fffffffffffffc08,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             in_stack_fffffffffffffc04);
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,
             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
  TPZMatrix<std::complex<float>_>::Add
            ((TPZMatrix<std::complex<float>_> *)in_stack_fffffffffffffcc0._M_value,
             (TPZMatrix<std::complex<float>_> *)in_stack_fffffffffffffcb8._M_value,
             in_stack_fffffffffffffcb0);
  TPZStepSolver<std::complex<float>_>::Solve
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,
             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
  TPZFMatrix<std::complex<float>_>::Resize
            ((TPZFMatrix<std::complex<float>_> *)
             CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),in_stack_fffffffffffffb80
             ,in_stack_fffffffffffffb78);
  TPZMatrix<std::complex<float>_>::Multiply(this_01,A,this_00,iVar6);
  std::complex<float>::complex(local_470,-1.0,0.0);
  TPZFMatrix<std::complex<float>_>::operator*=(in_stack_fffffffffffffae8,in_stack_fffffffffffffaf0);
  TPZMatrix<std::complex<float>_>::Add
            ((TPZMatrix<std::complex<float>_> *)in_stack_fffffffffffffcc0._M_value,
             (TPZMatrix<std::complex<float>_> *)in_stack_fffffffffffffcb8._M_value,
             in_stack_fffffffffffffcb0);
  (**(code **)(*local_18 + 0x68))(local_18,(long)iVar1,(long)local_1c);
  for (iVar6 = 0; iVar6 < local_1c; iVar6 = iVar6 + 1) {
    for (local_d0 = 0; local_d0 < iVar1; local_d0 = local_d0 + 1) {
      ppVar3 = TPZVec<std::pair<int,_int>_>::operator[]
                         ((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x5d8),(long)local_d0);
      TPZVec<std::complex<float>_>::operator[]
                ((TPZVec<std::complex<float>_> *)(in_RDI + 0x4b0),(long)(*ppVar3).first);
      in_stack_fffffffffffffaf0._M_value =
           (_ComplexT)
           TPZFMatrix<std::complex<float>_>::operator()
                     (in_stack_fffffffffffffaf0._M_value,(int64_t)in_stack_fffffffffffffae8,
                      CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      std::operator*(in_stack_fffffffffffffac8,(complex<float> *)0x1ffc93b);
      _Var5 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      in_stack_fffffffffffffae0 = extraout_XMM0_Dc_00;
      in_stack_fffffffffffffae4 = extraout_XMM0_Dd_00;
      pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                         ((TPZFMatrix<std::complex<float>_> *)in_stack_fffffffffffffaf0._M_value,
                          (int64_t)in_stack_fffffffffffffae8,
                          CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00));
      pcVar4->_M_value = _Var5;
    }
  }
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1ffca5f);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1ffca6c);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1ffca79);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1ffca86);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1ffca93);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1ffcaa0);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1ffcaad);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v2_local(TPZFMatrix<TVar> &residual_local, TPZFMatrix<TVar> &v2_local)
{
    int ncols = residual_local.Cols();
	TPZFMatrix<TVar> LocalWeightedResidual(fNEquations,ncols,0.);
	int neqs = fGlobalEqs.NElements();
	int i;
    for (int ic=0; ic<ncols; ic++) 
    {
        for (i=0;i<neqs;i++) 
        {
            std::pair<int,int> ind = fGlobalEqs[i];
            LocalWeightedResidual(ind.first,ic) += fWeights[ind.first] * residual_local(i,ic);
        }
    }
	int ncoarse = fCoarseIndex.NElements();
	// size of the kernel
	int nnull = fNullPivots.Rows();
	// number of global indices
	int nglob = fNEquations;
	/** Solving the system for zi */
	//Constructing I star is the same I star for Phi
	//C star is the same C star for Phi
	//Constructing I_lambda
	TPZFMatrix<TVar> I_lambda(ncoarse+nnull,ncols);
	I_lambda.Zero();
	//K_star_inv*C_star_trans is the same used for Phi
	/* Computing K_star_inv*W(i)*R(i)*r = K_star_inv*fLocalWeightedResidual */
	TPZFMatrix<TVar> KWeightedResidual(nglob,ncols);
	fInvertedStiffness.Solve(LocalWeightedResidual,KWeightedResidual);
	//Obtaining lambda_star
	TPZFMatrix<TVar> Lambda_star(ncoarse+nnull,1);
	TPZFMatrix<TVar> CstarKW(ncoarse+nnull,ncols);
	fC_star.MultAdd(KWeightedResidual,KWeightedResidual,CstarKW,-1,0,0);
	TPZFMatrix<TVar> temp2(ncoarse+nnull,ncols);
	I_lambda.Add(CstarKW,temp2);
	finv.Solve(temp2, Lambda_star);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		Lambda_star.Print("Lambda_star ",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//Obtaining z(i)
	TPZFMatrix<TVar> zi(nglob,ncols);
	temp2.Resize(nglob,ncols);
	fKeC_star.Multiply(Lambda_star,temp2);
	temp2 *= -1.;
	temp2.Add(KWeightedResidual,zi);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		zi.Print("zi ",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
#ifdef ZERO_INTERNAL_RESIDU
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		zi(fInternalEqs[i],0) = 0.;
	}
#endif
	v2_local.Resize(neqs, ncols);
    for (int ic=0; ic<ncols; ic++) 
    {
        for (i=0;i<neqs;i++) 
        {
            std::pair<int,int> ind = fGlobalEqs[i];
            v2_local(i,ic) = fWeights[ind.first] * zi(ind.first,ic);
        }
    }	
	
	
}